

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::ProjectionLight::PDF_Le(ProjectionLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  bool bVar2;
  float x;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float y;
  float fVar6;
  undefined1 auVar7 [16];
  float n2;
  float fVar8;
  float z;
  undefined1 auVar9 [16];
  Point2f local_18;
  
  *pdfPos = 0.0;
  fVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar8 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar8),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar8),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar8),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar6 = auVar9._0_4_;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar5,auVar5);
  auVar9 = vfmadd231ss_fma(auVar9,auVar4,auVar4);
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  fVar8 = auVar9._0_4_;
  auVar9._0_4_ = auVar4._0_4_ / fVar8;
  auVar9._4_12_ = auVar4._4_12_;
  if (this->hither <= auVar9._0_4_) {
    fVar6 = fVar6 / fVar8;
    auVar4._0_4_ = auVar5._0_4_ / fVar8;
    auVar4._4_12_ = auVar5._4_12_;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->ScreenFromLight).m.m[0][1])),auVar4,
                             ZEXT416((uint)(this->ScreenFromLight).m.m[0][0]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar9,ZEXT416((uint)(this->ScreenFromLight).m.m[0][2]));
    fVar8 = auVar5._0_4_ + (this->ScreenFromLight).m.m[0][3];
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->ScreenFromLight).m.m[3][1])),auVar4,
                             ZEXT416((uint)(this->ScreenFromLight).m.m[3][0]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar9,ZEXT416((uint)(this->ScreenFromLight).m.m[3][2]));
    fVar1 = auVar5._0_4_ + (this->ScreenFromLight).m.m[3][3];
    bVar2 = fVar1 == 1.0;
    local_18.super_Tuple2<pbrt::Point2,_float>.x =
         (float)((uint)bVar2 * (int)fVar8 + (uint)!bVar2 * (int)(fVar8 / fVar1));
    if (((this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.x <=
         local_18.super_Tuple2<pbrt::Point2,_float>.x) &&
       (local_18.super_Tuple2<pbrt::Point2,_float>.x <=
        (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.x)) {
      auVar5 = vfmadd132ss_fma(auVar4,ZEXT416((uint)(fVar6 * (this->ScreenFromLight).m.m[1][1])),
                               ZEXT416((uint)(this->ScreenFromLight).m.m[1][0]));
      auVar5 = vfmadd231ss_fma(auVar5,auVar9,ZEXT416((uint)(this->ScreenFromLight).m.m[1][2]));
      fVar6 = auVar5._0_4_ + (this->ScreenFromLight).m.m[1][3];
      local_18.super_Tuple2<pbrt::Point2,_float>.y =
           (float)((uint)bVar2 * (int)fVar6 + (uint)!bVar2 * (int)(fVar6 / fVar1));
      if (((this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.y <=
           local_18.super_Tuple2<pbrt::Point2,_float>.y) &&
         (local_18.super_Tuple2<pbrt::Point2,_float>.y <=
          (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.y)) {
        FVar3 = PiecewiseConstant2D::PDF(&this->distrib,&local_18);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>;
        auVar4 = vsubps_avx(auVar7,auVar5);
        auVar5 = vmovshdup_avx(auVar4);
        *pdfDir = (FVar3 * auVar4._0_4_ * auVar5._0_4_) /
                  (auVar9._0_4_ * auVar9._0_4_ * auVar9._0_4_ * this->A);
        return;
      }
    }
  }
  *pdfDir = 0.0;
  return;
}

Assistant:

void ProjectionLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;

    Vector3f w = Normalize(renderFromLight.ApplyInverse(ray.d));
    if (w.z < hither) {
        *pdfDir = 0;
        return;
    }
    Point3f ps = ScreenFromLight(Point3f(w));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds)) {
        *pdfDir = 0;
        return;
    }
    *pdfDir = distrib.PDF(Point2f(ps.x, ps.y)) * screenBounds.Area() / (A * Pow<3>(w.z));
}